

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

void RigidBodyDynamics::ForwardDynamicsAccelerationDeltas
               (Model *model,ConstraintSet *CS,VectorNd *QDDot_t,uint body_id,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_t)

{
  double dVar1;
  long lVar2;
  pointer pSVar3;
  double *pdVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Matrix<double,_6,_1,_0,_6,_1> *dst;
  long lVar13;
  long lVar14;
  ResScalar RVar15;
  long local_130;
  undefined1 local_128 [24];
  scalar_constant_op<double> local_110;
  long local_f0;
  Vector3d qdd_temp;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
  local_a0;
  SpatialVector Xa;
  
  uVar5 = 0;
  while( true ) {
    uVar6 = (ulong)uVar5;
    if ((ulong)(((long)(model->mBodies).
                       super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar6) break;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               (*(long *)(CS + 0x268) + uVar6 * 0x30));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               (uVar6 * 0x30 + *(long *)(CS + 0x280)));
    *(undefined8 *)(*(long *)(CS + 0x298) + uVar6 * 8) = 0;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (uVar6 * 0x18 + *(long *)(CS + 0x2e8)));
    uVar5 = uVar5 + 1;
  }
  uVar6 = (ulong)body_id;
  lVar9 = uVar6 * 0x30;
  local_130 = uVar6 * 0x90;
  lVar13 = uVar6 * 0x18;
  lVar10 = uVar6 * 4;
  lVar14 = uVar6 * 0x60;
  local_f0 = uVar6 * 0x48;
  lVar11 = 0;
  do {
    lVar12 = lVar9 + lVar11;
    if (lVar12 == 0) {
      *(QDDot_t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           0.0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
                (*(Matrix<double,_6,_1,_0,_6,_1> **)(CS + 0x280),
                 &((model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start)->super_Matrix<double,_6,_1,_0,_6,_1>);
      uVar6 = 1;
      while( true ) {
        if ((ulong)(((long)(model->mBodies).
                           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model->mBodies).
                          super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar6) break;
        uVar5 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6].q_index;
        Math::SpatialTransform::apply
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar6,
                   (SpatialVector *)
                   ((ulong)(model->lambda).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar6] * 0x30 + *(long *)(CS + 0x280)));
        if ((model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar6].mDoFCount == 3) {
          local_128._0_8_ =
               (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar6;
          local_128._8_8_ = uVar6 * 0x18 + *(long *)(CS + 0x2e8);
          local_128._16_8_ =
               (model->multdof3_U).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar6;
          local_110.m_other = (double)&Xa;
          Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
          _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&qdd_temp,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                      *)local_128);
          pdVar4 = (QDDot_t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          pdVar4[uVar5] =
               qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
          pdVar4[uVar5 + 1] =
               qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1];
          pdVar4[uVar5 + 2] =
               qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
          local_128._0_8_ =
               (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar6;
          local_128._8_8_ =
               (model->multdof3_S).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar6;
          local_128._16_8_ = &qdd_temp.super_Vector3d;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    ((Matrix<double,_6,_1,_0,_6,_1> *)local_128._0_8_,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                      *)local_128);
          local_128._8_8_ =
               (model->multdof3_S).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar6;
          local_128._0_8_ = &Xa;
          local_128._16_8_ = &qdd_temp.super_Vector3d;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    ((Matrix<double,_6,_1,_0,_6,_1> *)(uVar6 * 0x30 + *(long *)(CS + 0x280)),
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                      *)local_128);
        }
        else {
          dVar1 = *(double *)(*(long *)(CS + 0x298) + uVar6 * 8);
          RVar15 = Eigen::internal::
                   dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
                   ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         ((model->U).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar6),
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&Xa);
          local_110.m_other =
               (dVar1 - RVar15) /
               (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar6];
          (QDDot_t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          [uVar5] = local_110.m_other;
          local_128._8_8_ =
               (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar6;
          local_128._0_8_ = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&Xa;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                    ((Matrix<double,_6,_1,_0,_6,_1> *)(uVar6 * 0x30 + *(long *)(CS + 0x280)),
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                      *)local_128);
        }
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      return;
    }
    if (lVar11 == 0) {
      Math::SpatialTransform::applyAdjoint
                (&Xa,(model->X_base).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar6,
                 (f_t->super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar6);
      local_128._0_8_ = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&Xa;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>>
                ((Matrix<double,_6,_1,_0,_6,_1> *)(*(long *)(CS + 0x268) + lVar9),
                 (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                  *)local_128);
    }
    if (*(int *)((long)&((model->mJoints).
                         super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ._M_impl.super__Vector_impl_data._M_start)->mDoFCount + lVar13) == 3) {
      Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           (double)((long)&(((model->multdof3_S).
                             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             .
                             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage +
                   local_130);
      Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
           (double)(*(long *)(CS + 0x268) + lVar9 + lVar11);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>const>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)(*(long *)(CS + 0x2e8) + lVar13),
                 (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                  *)&Xa);
      uVar7 = (ulong)*(uint *)((long)(model->lambda).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar10);
      if (uVar7 != 0) {
        lVar2 = *(long *)(CS + 0x268);
        lVar8 = uVar7 * 0x30;
        pSVar3 = (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] = (double)(lVar12 + lVar2);
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[1] =
             (double)((long)&(((model->multdof3_U).
                               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               .
                               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                     + local_130);
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] =
             (double)((long)&(((model->multdof3_Dinv).
                               super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_Matrix3d).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     + local_f0);
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_128,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)&qdd_temp);
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)((long)&(pSVar3->E).super_Matrix3d + lVar14),
                   (SpatialVector *)local_128);
        dst = (Matrix<double,_6,_1,_0,_6,_1> *)(lVar8 + *(long *)(CS + 0x268));
        local_a0.m_lhs = (LhsNested)(lVar8 + lVar2);
        local_a0.m_rhs = &Xa.super_Matrix<double,_6,_1,_0,_6,_1>;
LAB_00114ede:
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                  (dst,&local_a0);
      }
    }
    else {
      RVar15 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     ((long)&(model->S).
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             .
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar6].
                             super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar11),
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     (*(long *)(CS + 0x268) + lVar9 + lVar11));
      *(double *)(*(long *)(CS + 0x298) + lVar10 * 2) = -RVar15;
      uVar7 = (ulong)*(uint *)((long)(model->lambda).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar10);
      if (uVar7 != 0) {
        lVar2 = *(long *)(CS + 0x268);
        lVar8 = uVar7 * 0x30;
        pSVar3 = (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)(lVar12 + lVar2);
        Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)((long)&(model->U).
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             .
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar6].
                             super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar11);
        Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
             -RVar15;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&qdd_temp,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                    *)&Xa);
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)((long)&(pSVar3->E).super_Matrix3d + lVar14),
                   (SpatialVector *)&qdd_temp);
        dst = (Matrix<double,_6,_1,_0,_6,_1> *)(lVar8 + *(long *)(CS + 0x268));
        local_a0.m_lhs = (LhsNested)(lVar2 + lVar8);
        local_a0.m_rhs = (RhsNested)local_128;
        goto LAB_00114ede;
      }
    }
    lVar11 = lVar11 + -0x30;
    local_130 = local_130 + -0x90;
    lVar13 = lVar13 + -0x18;
    lVar10 = lVar10 + -4;
    lVar14 = lVar14 + -0x60;
    local_f0 = local_f0 + -0x48;
  } while( true );
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
		Model &model,
		ConstraintSet &CS,
		VectorNd &QDDot_t,
		const unsigned int body_id,
		const std::vector<SpatialVector> &f_t
		) {
	LOG << "-------- " << __func__ << " ------" << std::endl;

	assert (CS.d_pA.size() == model.mBodies.size());
	assert (CS.d_a.size() == model.mBodies.size());
	assert (CS.d_u.size() == model.mBodies.size());

	// TODO reset all values (debug)
	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		CS.d_pA[i].setZero();
		CS.d_a[i].setZero();
		CS.d_u[i] = 0.;
		CS.d_multdof3_u[i].setZero();
	}

	for (unsigned int i = body_id; i > 0; i--) {
		if (i == body_id) {
			CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
		}

		if (model.mJoints[i].mDoFCount == 3) {
			CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				CS.d_pA[lambda] = CS.d_pA[lambda] + model.X_lambda[i].applyTranspose (CS.d_pA[i] + model.multdof3_U[i] * model.multdof3_Dinv[i] * CS.d_multdof3_u[i]);
			}
		} else {
			CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				CS.d_pA[lambda] = CS.d_pA[lambda] + model.X_lambda[i].applyTranspose (CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
			}
		}
	}

	for (unsigned int i = 0; i < f_t.size(); i++) {
		LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
	}

	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
	}
	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
	}

	QDDot_t[0] = 0.;
	CS.d_a[0] = model.a[0];

	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		unsigned int q_index = model.mJoints[i].q_index;
		unsigned int lambda = model.lambda[i];

		SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

		if (model.mJoints[i].mDoFCount == 3) {
			Vector3d qdd_temp = model.multdof3_Dinv[i] * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);
			QDDot_t[q_index] = qdd_temp[0];
			QDDot_t[q_index + 1] = qdd_temp[1];
			QDDot_t[q_index + 2] = qdd_temp[2];
			model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
			CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
		} else {
			QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
			CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
		}
	
		LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
		LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
	}
}